

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::handle(Fl_Input *this,int event)

{
  int iVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Fl_Widget *pFVar12;
  Fl_Window *pFVar13;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  Fl_Boxtype b;
  int tmp;
  int old_position;
  Fl_Boxtype b_2;
  Fl_Boxtype b_1;
  int oldmark;
  int oldpos;
  int event_local;
  Fl_Input *this_local;
  
  switch(event) {
  case 1:
    iVar4 = Fl::dnd_text_ops();
    if (iVar4 != 0) {
      iVar4 = Fl_Input_::position(&this->super_Fl_Input_);
      iVar5 = Fl_Input_::mark(&this->super_Fl_Input_);
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      iVar6 = Fl_Widget::x((Fl_Widget *)this);
      iVar7 = Fl::box_dx(FVar3);
      iVar8 = Fl_Widget::y((Fl_Widget *)this);
      iVar9 = Fl::box_dy(FVar3);
      iVar10 = Fl_Widget::w((Fl_Widget *)this);
      iVar11 = Fl::box_dw(FVar3);
      iVar1 = Fl_Widget::h((Fl_Widget *)this);
      iVar2 = Fl::box_dh(FVar3);
      Fl_Input_::handle_mouse
                (&this->super_Fl_Input_,iVar6 + iVar7,iVar8 + iVar9,iVar10 - iVar11,iVar1 - iVar2,0)
      ;
      handle::newpos = Fl_Input_::position(&this->super_Fl_Input_);
      Fl_Input_::position(&this->super_Fl_Input_,iVar4,iVar5);
      pFVar12 = Fl::focus();
      if ((((pFVar12 == (Fl_Widget *)this) && (iVar4 = Fl::event_state(0x10000), iVar4 == 0)) &&
          (iVar5 = Fl_Input_::input_type(&this->super_Fl_Input_), iVar4 = handle::newpos, iVar5 != 5
          )) && (((iVar6 = Fl_Input_::mark(&this->super_Fl_Input_), iVar5 = handle::newpos,
                  iVar6 <= iVar4 &&
                  (iVar4 = Fl_Input_::position(&this->super_Fl_Input_), iVar5 < iVar4)) ||
                 ((iVar4 = handle::newpos, iVar6 = Fl_Input_::position(&this->super_Fl_Input_),
                  iVar5 = handle::newpos, iVar6 <= iVar4 &&
                  (iVar4 = Fl_Input_::mark(&this->super_Fl_Input_), iVar5 < iVar4)))))) {
        handle::drag_start = handle::newpos;
        return 1;
      }
      handle::drag_start = -1;
    }
    pFVar12 = Fl::focus();
    if (pFVar12 != (Fl_Widget *)this) {
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
    goto switchD_001f6870_caseD_3;
  case 2:
    iVar4 = Fl::event_button();
    if (iVar4 == 2) {
      Fl::event_is_click(0);
      Fl::paste((Fl_Widget *)this,0);
    }
    else {
      iVar4 = Fl::event_is_click();
      if (iVar4 == 0) {
        Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)0x0,src_00);
      }
      else {
        iVar4 = Fl::event_is_click();
        if ((iVar4 == 0) || (handle::drag_start < 0)) {
          iVar4 = Fl::event_clicks();
          if (iVar4 != 0) {
            Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)0x0,src_01);
          }
        }
        else {
          Fl_Input_::position(&this->super_Fl_Input_,handle::drag_start,handle::drag_start);
          handle::drag_start = -1;
        }
      }
    }
    iVar4 = Fl_Input_::readonly(&this->super_Fl_Input_);
    if (iVar4 != 0) {
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    this_local._4_4_ = 1;
    break;
  default:
    goto switchD_001f6870_caseD_3;
  case 5:
    iVar4 = Fl::dnd_text_ops();
    if ((iVar4 != 0) && (-1 < handle::drag_start)) {
      iVar4 = Fl::event_is_click();
      if (iVar4 != 0) {
        return 1;
      }
      handle::dnd_save_position = Fl_Input_::position(&this->super_Fl_Input_);
      handle::dnd_save_mark = Fl_Input_::mark(&this->super_Fl_Input_);
      handle::dnd_save_focus = (Fl_Widget *)this;
      Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)0x0,src);
      Fl::dnd();
      return 1;
    }
    goto switchD_001f6870_caseD_3;
  case 6:
    iVar4 = Fl::event_key();
    if (iVar4 == 0xff09) {
      iVar4 = Fl_Input_::size(&this->super_Fl_Input_);
      Fl_Input_::position(&this->super_Fl_Input_,iVar4,0);
    }
    else if (iVar4 == 0xff51) {
      iVar4 = Fl_Input_::size(&this->super_Fl_Input_);
      Fl_Input_::position(&this->super_Fl_Input_,iVar4);
    }
    else if (iVar4 == 0xff52) {
      iVar4 = Fl_Input_::size(&this->super_Fl_Input_);
      iVar4 = Fl_Input_::line_start(&this->super_Fl_Input_,iVar4);
      Fl_Input_::up_down_position(&this->super_Fl_Input_,iVar4,0);
    }
    else if (iVar4 == 0xff53) {
      Fl_Input_::position(&this->super_Fl_Input_,0);
    }
    else if (iVar4 == 0xff54) {
      Fl_Input_::up_down_position(&this->super_Fl_Input_,0,0);
    }
    else {
      iVar4 = Fl_Input_::position(&this->super_Fl_Input_);
      iVar5 = Fl_Input_::mark(&this->super_Fl_Input_);
      Fl_Input_::position(&this->super_Fl_Input_,iVar4,iVar5);
    }
switchD_001f6870_caseD_3:
    FVar3 = Fl_Widget::box((Fl_Widget *)this);
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl::box_dx(FVar3);
    iVar6 = Fl_Widget::y((Fl_Widget *)this);
    iVar7 = Fl::box_dy(FVar3);
    iVar8 = Fl_Widget::w((Fl_Widget *)this);
    iVar9 = Fl::box_dw(FVar3);
    iVar10 = Fl_Widget::h((Fl_Widget *)this);
    iVar11 = Fl::box_dh(FVar3);
    this_local._4_4_ =
         Fl_Input_::handletext
                   (&this->super_Fl_Input_,event,iVar4 + iVar5,iVar6 + iVar7,iVar8 - iVar9,
                    iVar10 - iVar11);
    break;
  case 8:
    iVar4 = Fl::event_key();
    if ((((iVar4 == 0xff09) && (iVar4 = Fl::event_state(0x10000), iVar4 == 0)) &&
        (iVar4 = Fl_Input_::tab_nav(&this->super_Fl_Input_), iVar4 == 0)) &&
       ((iVar4 = Fl_Input_::input_type(&this->super_Fl_Input_), iVar4 == 4 &&
        (iVar4 = Fl_Input_::size(&this->super_Fl_Input_), 0 < iVar4)))) {
      iVar4 = Fl_Input_::mark(&this->super_Fl_Input_);
      if (iVar4 == 0) {
        iVar4 = Fl_Input_::position(&this->super_Fl_Input_);
        iVar5 = Fl_Input_::size(&this->super_Fl_Input_);
        if (iVar4 == iVar5) goto LAB_001f6a02;
      }
      iVar4 = Fl_Input_::position(&this->super_Fl_Input_);
      if (iVar4 == 0) {
        iVar4 = Fl_Input_::mark(&this->super_Fl_Input_);
        iVar5 = Fl_Input_::size(&this->super_Fl_Input_);
        if (iVar4 == iVar5) {
LAB_001f6a02:
          iVar4 = Fl_Input_::mark(&this->super_Fl_Input_);
          iVar5 = Fl_Input_::position(&this->super_Fl_Input_);
          if (iVar5 < iVar4) {
            iVar4 = Fl_Input_::mark(&this->super_Fl_Input_);
            Fl_Input_::position(&this->super_Fl_Input_,iVar4);
          }
          else {
            iVar4 = Fl_Input_::position(&this->super_Fl_Input_);
            Fl_Input_::position(&this->super_Fl_Input_,iVar4);
          }
          return 1;
        }
      }
    }
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (((iVar4 != 0) &&
        (pFVar13 = Fl_Widget::window((Fl_Widget *)this), pFVar13 != (Fl_Window *)0x0)) &&
       (pFVar12 = Fl::belowmouse(), (Fl_Widget *)this == pFVar12)) {
      pFVar13 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar13,FL_CURSOR_NONE);
    }
    this_local._4_4_ = handle_key(this);
    break;
  case 0x14:
    Fl::belowmouse((Fl_Widget *)this);
    if (handle::dnd_save_focus != (Fl_Widget *)this) {
      handle::dnd_save_position = Fl_Input_::position(&this->super_Fl_Input_);
      handle::dnd_save_mark = Fl_Input_::mark(&this->super_Fl_Input_);
      handle::dnd_save_focus = Fl::focus();
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
  case 0x15:
    FVar3 = Fl_Widget::box((Fl_Widget *)this);
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl::box_dx(FVar3);
    iVar6 = Fl_Widget::y((Fl_Widget *)this);
    iVar7 = Fl::box_dy(FVar3);
    iVar8 = Fl_Widget::w((Fl_Widget *)this);
    iVar9 = Fl::box_dw(FVar3);
    iVar10 = Fl_Widget::h((Fl_Widget *)this);
    iVar11 = Fl::box_dh(FVar3);
    Fl_Input_::handle_mouse
              (&this->super_Fl_Input_,iVar4 + iVar5,iVar6 + iVar7,iVar8 - iVar9,iVar10 - iVar11,0);
    this_local._4_4_ = 1;
    break;
  case 0x16:
    Fl_Input_::position(&this->super_Fl_Input_,handle::dnd_save_position,handle::dnd_save_mark);
    if ((handle::dnd_save_focus != (Fl_Widget *)0x0) &&
       (handle::dnd_save_focus != (Fl_Widget *)this)) {
      Fl::focus(handle::dnd_save_focus);
      (*(this->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[3])(this,7);
    }
    pFVar13 = Fl::first_window();
    Fl_Window::cursor(pFVar13,FL_CURSOR_MOVE);
    handle::dnd_save_focus = (Fl_Widget *)0x0;
    this_local._4_4_ = 1;
    break;
  case 0x17:
    if (handle::dnd_save_focus == (Fl_Widget *)this) {
      iVar5 = Fl_Input_::position(&this->super_Fl_Input_);
      iVar4 = handle::dnd_save_mark;
      if (handle::dnd_save_position < handle::dnd_save_mark) {
        handle::dnd_save_mark = handle::dnd_save_position;
        handle::dnd_save_position = iVar4;
      }
      Fl_Input_::replace(&this->super_Fl_Input_,handle::dnd_save_mark,handle::dnd_save_position,
                         (char *)0x0,0);
      if (handle::dnd_save_position < iVar5) {
        Fl_Input_::position(&this->super_Fl_Input_,
                            iVar5 - (handle::dnd_save_position - handle::dnd_save_mark));
      }
      else {
        Fl_Input_::position(&this->super_Fl_Input_,iVar5);
      }
    }
    else if (handle::dnd_save_focus != (Fl_Widget *)0x0) {
      (*handle::dnd_save_focus->_vptr_Fl_Widget[3])(handle::dnd_save_focus,7);
    }
    handle::dnd_save_focus = (Fl_Widget *)0x0;
    Fl_Widget::take_focus((Fl_Widget *)this);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input::handle(int event) {
  static int dnd_save_position, dnd_save_mark, drag_start = -1, newpos;
  static Fl_Widget *dnd_save_focus = NULL;
  switch (event) {
#ifdef __APPLE__
    case FL_UNFOCUS:
      if (Fl::compose_state) {
	this->mark( this->position() );
	Fl::reset_marked_text();
      }
      break;
#endif
    case FL_FOCUS:
      switch (Fl::event_key()) {
        case FL_Right:
          position(0);
          break;
        case FL_Left:
          position(size());
          break;
        case FL_Down:
          up_down_position(0);
          break;
        case FL_Up:
          up_down_position(line_start(size()));
          break;
        case FL_Tab:
          position(size(),0);
          break;
        default:
          position(position(),mark());// turns off the saved up/down arrow position
          break;
      }
      break;
      
    case FL_KEYBOARD:
      // Handle special case for multiline input with 'old tab behavior'
      // where tab is entered as a character: make sure user attempt to 'tab over'
      // widget doesn't destroy the field, replacing it with a tab character.
      //
      if (Fl::event_key() == FL_Tab 			// Tab key?
          && !Fl::event_state(FL_SHIFT)			// no shift?
          && !tab_nav()					// with tab navigation disabled?
	  && input_type() == FL_MULTILINE_INPUT		// with a multiline input?
	  && size() > 0                                 // non-empty field?
          && ((mark()==0 && position()==size()) || (position()==0 && mark()==size()))) {// while entire field selected?
        // Set cursor to the end of the selection...
        if (mark() > position())
          position(mark());
        else
          position(position());
        return (1);
      } else {
        if (active_r() && window() && this == Fl::belowmouse()) 
          window()->cursor(FL_CURSOR_NONE);
        return handle_key();
      }
      //NOTREACHED
      
    case FL_PUSH:
      if (Fl::dnd_text_ops()) {
        int oldpos = position(), oldmark = mark();
        Fl_Boxtype b = box();
        Fl_Input_::handle_mouse(x()+Fl::box_dx(b), y()+Fl::box_dy(b),
                                w()-Fl::box_dw(b), h()-Fl::box_dh(b), 0);
        newpos = position(); 
        position( oldpos, oldmark );
        if (Fl::focus()==this && !Fl::event_state(FL_SHIFT) && input_type()!=FL_SECRET_INPUT &&
           ( (newpos >= mark() && newpos < position()) || 
             (newpos >= position() && newpos < mark()) ) ) {
          // user clicked in the selection, may be trying to drag
          drag_start = newpos;
          return 1;
        }
        drag_start = -1;
      }
      
      if (Fl::focus() != this) {
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      break;
      
    case FL_DRAG:
      if (Fl::dnd_text_ops()) {
        if (drag_start >= 0) {
          if (Fl::event_is_click()) return 1; // debounce the mouse
                                              // save the position because sometimes we don't get DND_ENTER:
          dnd_save_position = position();
          dnd_save_mark = mark();
	  dnd_save_focus = this;
          // drag the data:
          copy(0);
#ifdef __APPLE__
          Fl_X::dnd(1);
#else
          Fl::dnd();
#endif
          return 1;
        }
      }
      break;
      
    case FL_RELEASE:
      if (Fl::event_button() == 2) {
        Fl::event_is_click(0); // stop double click from picking a word
        Fl::paste(*this, 0);
      } else if (!Fl::event_is_click()) {
        // copy drag-selected text to the clipboard.
        copy(0);
      } else if (Fl::event_is_click() && drag_start >= 0) {
        // user clicked in the field and wants to reset the cursor position...
        position(drag_start, drag_start);
        drag_start = -1;
      } else if (Fl::event_clicks()) {
        // user double or triple clicked to select word or whole text
        copy(0);
      }
      
      // For output widgets, do the callback so the app knows the user
      // did something with the mouse...
      if (readonly()) do_callback();
      
      return 1;
      
    case FL_DND_ENTER:
      Fl::belowmouse(this); // send the leave events first
      if (dnd_save_focus != this) {
	dnd_save_position = position();
	dnd_save_mark = mark();
	dnd_save_focus = Fl::focus();
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      // fall through:
    case FL_DND_DRAG: 
      //int p = mouse_position(X, Y, W, H);
#ifdef DND_OUT_XXXX
      if (Fl::focus()==this && (p>=dnd_save_position && p<=dnd_save_mark ||
                                p>=dnd_save_mark && p<=dnd_save_position)) {
        position(dnd_save_position, dnd_save_mark);
        return 0;
      }
#endif
      {
        Fl_Boxtype b = box();
        Fl_Input_::handle_mouse(x()+Fl::box_dx(b), y()+Fl::box_dy(b),
                                w()-Fl::box_dw(b), h()-Fl::box_dh(b), 0);
      }
      return 1;
      
    case FL_DND_LEAVE:
      position(dnd_save_position, dnd_save_mark);
#ifdef DND_OUT_XXXX
      if (!focused())
#endif
        if (dnd_save_focus && dnd_save_focus != this) {
          Fl::focus(dnd_save_focus);
          handle(FL_UNFOCUS);
        }
#if !(defined(__APPLE__) || defined(WIN32))
      Fl::first_window()->cursor(FL_CURSOR_MOVE);
#endif
      dnd_save_focus = NULL;
      return 1;
      
    case FL_DND_RELEASE:
      if (dnd_save_focus == this) { // if the dragged text comes from the same widget
	// remove the selected text
	int old_position = position();
	if (dnd_save_mark > dnd_save_position) {
	  int tmp = dnd_save_mark;
	  dnd_save_mark = dnd_save_position;
	  dnd_save_position = tmp;
	  }
	replace(dnd_save_mark, dnd_save_position, NULL, 0);
	if (old_position > dnd_save_position) position(old_position - (dnd_save_position - dnd_save_mark));
	else position(old_position);
	}
      else if(dnd_save_focus) {
	dnd_save_focus->handle(FL_UNFOCUS);
	}
      dnd_save_focus = NULL;
      take_focus();
      return 1;
      
      /* TODO: this will scroll the area, but stop if the cursor would become invisible.
       That clipping happens in drawtext(). Do we change the clipping or should 
       we move the cursor (ouch)?
       case FL_MOUSEWHEEL:
       if (Fl::e_dy > 0) {
       yscroll( yscroll() - Fl::e_dy*15 );
       } else if (Fl::e_dy < 0) {
       yscroll( yscroll() - Fl::e_dy*15 );
       }
       return 1;
       */
  }
  Fl_Boxtype b = box();
  return Fl_Input_::handletext(event,
                               x()+Fl::box_dx(b), y()+Fl::box_dy(b),
                               w()-Fl::box_dw(b), h()-Fl::box_dh(b));
}